

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ptr<Expression> __thiscall Parser::expression(Parser *this)

{
  int iVar1;
  bool bVar2;
  undefined8 extraout_RAX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Parser *in_RSI;
  ptr<Expression> pVar4;
  initializer_list<TokenType> __l;
  __shared_ptr<Assignment,_(__gnu_cxx::_Lock_policy)2> local_90;
  ptr<Symbol> symbol;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  ptr<Operation> additionalOperation;
  
  disjunction(this);
  additionalOperation.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x1200000011;
  additionalOperation.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = 0x14;
  additionalOperation.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = 0x13;
  __l._M_len = 7;
  __l._M_array = (iterator)&additionalOperation;
  std::vector<TokenType,_std::allocator<TokenType>_>::vector
            ((vector<TokenType,_std::allocator<TokenType>_> *)&symbol,__l,
             (allocator_type *)&local_90);
  bVar2 = matchAny(in_RSI,(vector<TokenType,_std::allocator<TokenType>_> *)&symbol);
  std::_Vector_base<TokenType,_std::allocator<TokenType>_>::~_Vector_base
            ((_Vector_base<TokenType,_std::allocator<TokenType>_> *)&symbol);
  _Var3._M_pi = extraout_RDX;
  if (bVar2) {
    std::dynamic_pointer_cast<Symbol,Expression>((shared_ptr<Expression> *)&symbol);
    if (symbol.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0)
    {
      error(in_RSI,"The left operand of the assignment operator is not an lvalue");
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&additionalOperation.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&symbol.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->filepath)._M_string_length);
      _Unwind_Resume(extraout_RAX);
    }
    Token::Token((Token *)&additionalOperation,&in_RSI->currentToken);
    iVar1 = (int)additionalOperation.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
    std::__cxx11::string::~string
              ((string *)
               &additionalOperation.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    consume(in_RSI);
    additionalOperation.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    additionalOperation.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _0_4_ = 0;
    additionalOperation.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 0;
    if (iVar1 - 0x12U < 6) {
      pVar4.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> =
           (__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)
           (*(code *)(&DAT_0011f184 + *(int *)(&DAT_0011f184 + (ulong)(iVar1 - 0x12U) * 4)))();
      return (ptr<Expression>)pVar4.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
    }
    disjunction((Parser *)&stack0xffffffffffffff98);
    std::
    make_shared<Assignment,std::shared_ptr<Operation>&,std::shared_ptr<Symbol>&,std::shared_ptr<Expression>&>
              ((shared_ptr<Operation> *)&local_90,(shared_ptr<Symbol> *)&additionalOperation,
               (shared_ptr<Expression> *)&symbol);
    std::__shared_ptr<Expression,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Expression,(__gnu_cxx::_Lock_policy)2> *)this,&local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&additionalOperation.super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&symbol.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    _Var3._M_pi = extraout_RDX_00;
  }
  pVar4.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  pVar4.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar4.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::expression() {
    ptr<Expression> expr = disjunction();

    if(matchAny({ TokenType::Assign, TokenType::PlusAssign, TokenType::MultAssign, TokenType::MinusAssign, TokenType::DivAssign, TokenType::ExpAssign, TokenType::ModAssign })) {
        // todo: Do a better symbol check!!!
        ptr<Symbol> symbol = std::dynamic_pointer_cast<Symbol>(expr);
        if(!symbol)
            error("The left operand of the assignment operator is not an lvalue");

        TokenType assignType = token().type;
        consume();
        ptr<Operation> additionalOperation;

        if(assignType == TokenType::PlusAssign)
            additionalOperation = make<Addition>();
        else if(assignType == TokenType::MultAssign)
            additionalOperation = make<Multiplication>();
        else if(assignType == TokenType::MinusAssign)
            additionalOperation = make<Subtraction>();
        else if(assignType == TokenType::DivAssign)
            additionalOperation = make<Division>();
        else if(assignType == TokenType::ExpAssign)
            additionalOperation = make<Exponentiation>();
        else if(assignType == TokenType::ModAssign)
            additionalOperation = make<Modulo>();

        expr = make<Assignment>(additionalOperation, symbol, disjunction());
    }

    return expr;
}